

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_entry.hpp
# Opt level: O3

void __thiscall
asio::ip::basic_resolver_entry<asio::ip::tcp>::basic_resolver_entry
          (basic_resolver_entry<asio::ip::tcp> *this,endpoint_type *ep,string *host,string *service)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  uVar2 = *(undefined8 *)&(ep->impl_).data_;
  uVar3 = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
  uVar4 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x14);
  *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 0xc) =
       *(undefined8 *)((long)&(ep->impl_).data_ + 0xc);
  *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 0x14) = uVar4;
  *(undefined8 *)&(this->endpoint_).impl_.data_ = uVar2;
  *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 8) = uVar3;
  (this->host_name_)._M_dataplus._M_p = (pointer)&(this->host_name_).field_2;
  pcVar1 = (host->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host_name_,pcVar1,pcVar1 + host->_M_string_length);
  (this->service_name_)._M_dataplus._M_p = (pointer)&(this->service_name_).field_2;
  pcVar1 = (service->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->service_name_,pcVar1,pcVar1 + service->_M_string_length);
  return;
}

Assistant:

basic_resolver_entry(const endpoint_type& ep,
      const std::string& host, const std::string& service)
    : endpoint_(ep),
      host_name_(host),
      service_name_(service)
  {
  }